

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse_new.hpp
# Opt level: O2

const_reference_value __thiscall
Disa::Matrix_Sparse_Row<double,_int>::at(Matrix_Sparse_Row<double,_int> *this,index_type *column)

{
  pointer piVar1;
  __normal_iterator<int_*,_std::span<int,_18446744073709551615UL>_> _Var2;
  ostream *poVar3;
  source_location *location;
  string sStack_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined **local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  piVar1 = (this->i_column)._M_ptr;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<int*,std::span<int,18446744073709551615ul>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                    (piVar1,piVar1 + (this->i_column)._M_extent._M_extent_value,column);
  location = (source_location *)(this->i_column)._M_ptr;
  if (_Var2._M_current !=
      (int *)((long)&location->_M_impl + (this->i_column)._M_extent._M_extent_value * 4)) {
    return (const_reference_value)
           (((long)_Var2._M_current - (long)location) * 2 + (long)(this->value)._M_ptr);
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"\n");
  local_48 = &PTR_s__workspace_llm4binary_github_lic_001555c8;
  console_format_abi_cxx11_(&local_40,(Disa *)0x0,(Log_Level)&local_48,location);
  poVar3 = std::operator<<(poVar3,(string *)&local_40);
  std::__cxx11::to_string(&local_e8,*column);
  std::operator+(&local_c8,"Column index ",&local_e8);
  std::operator+(&local_a8,&local_c8,", is out of range for row ");
  std::__cxx11::to_string
            (&sStack_108,
             (int)((ulong)((long)(this->iter_row_offset)._M_current -
                          (long)(this->ptr_data->row_offset).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2));
  std::operator+(&local_88,&local_a8,&sStack_108);
  std::operator+(&local_68,&local_88,".");
  poVar3 = std::operator<<(poVar3,(string *)&local_68);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&sStack_108);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_40);
  exit(1);
}

Assistant:

[[nodiscard]] const_reference_value at(const index_type& column) const {
    auto iter = std::find(i_column.begin(), i_column.end(), column);
    ASSERT(iter != i_column.end(),
           "Column index " + std::to_string(column) + ", is out of range for row " + std::to_string(row()) + ".");
    return *(value.begin() + std::distance(i_column.begin(), iter));
  }